

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O2

void __thiscall
despot::MemoryPool<despot::ChainState>::~MemoryPool(MemoryPool<despot::ChainState> *this)

{
  DeleteAll(this);
  std::_Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>::~_Vector_base
            (&(this->freelist_).
              super__Vector_base<despot::ChainState_*,_std::allocator<despot::ChainState_*>_>);
  std::
  _Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
  ::~_Vector_base((_Vector_base<despot::MemoryPool<despot::ChainState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::ChainState>::Chunk_*>_>
                   *)this);
  return;
}

Assistant:

~MemoryPool() {
		DeleteAll();
	}